

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O0

vector<unsigned_char> * __thiscall
lzham::vector<unsigned_char>::operator=(vector<unsigned_char> *this,vector<unsigned_char> *other)

{
  bool bVar1;
  vector<unsigned_char> *in_RSI;
  vector<unsigned_char> *in_RDI;
  uint in_stack_000001d4;
  char *in_stack_000001d8;
  char *in_stack_000001e0;
  undefined1 in_stack_ffffffffffffffda;
  undefined1 in_stack_ffffffffffffffdb;
  uint in_stack_ffffffffffffffdc;
  vector<unsigned_char> *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    if (in_RDI->m_capacity < in_RSI->m_size) {
      clear(in_RDI);
      bVar1 = increase_capacity(in_RDI,in_stack_ffffffffffffffdc,(bool)in_stack_ffffffffffffffdb,
                                (bool)in_stack_ffffffffffffffda);
      if (!bVar1) {
        lzham_fail(in_stack_000001e0,in_stack_000001d8,in_stack_000001d4);
        return in_RDI;
      }
    }
    else {
      try_resize(in_RSI,(uint)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
    }
    memcpy(in_RDI->m_p,in_RSI->m_p,(ulong)in_RSI->m_size);
    in_RDI->m_size = in_RSI->m_size;
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

inline vector& operator= (const vector& other)
      {
         if (this == &other)
            return *this;

         if (m_capacity >= other.m_size)
            try_resize(0);
         else
         {
            clear();
            if (!increase_capacity(other.m_size, false))
            {
               LZHAM_FAIL("lzham::vector operator=: Out of memory!");
               return *this;
            }
         }

         if (LZHAM_IS_BITWISE_COPYABLE(T))
            memcpy(m_p, other.m_p, other.m_size * sizeof(T));
         else
         {
            T* pDst = m_p;
            const T* pSrc = other.m_p;
            for (uint i = other.m_size; i > 0; i--)
               helpers::construct(pDst++, *pSrc++);
         }

         m_size = other.m_size;

         return *this;
      }